

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O0

bool read_jpeg_image(QImage *outImage,QSize scaledSize,QRect scaledClipRect,QRect clipRect,
                    int quality,Rgb888ToRgb32Converter converter,j_decompress_ptr info,
                    my_error_mgr *err,bool invertCMYK)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  long *plVar9;
  undefined8 uVar10;
  undefined8 in_RCX;
  undefined8 in_RDX;
  QSize in_RSI;
  AspectRatioMode in_EDI;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  QRect QVar11;
  int in_stack_00000008;
  code *in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  byte in_stack_00000028;
  int i;
  quint32 *out_1;
  uchar *in_1;
  QRgb *out;
  uchar *in;
  int y_1;
  JSAMPARRAY rows;
  bool quickGray;
  double f;
  int height;
  int width;
  int y;
  int x;
  uchar *row;
  QRect clip;
  QRect imageRect;
  int in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  int in_stack_fffffffffffffd80;
  undefined2 in_stack_fffffffffffffd84;
  undefined1 in_stack_fffffffffffffd86;
  undefined1 in_stack_fffffffffffffd87;
  undefined1 uVar12;
  QRect *in_stack_fffffffffffffd88;
  jpeg_decompress_struct *in_stack_fffffffffffffd90;
  QImage *in_stack_fffffffffffffd98;
  void *__src;
  bool local_211;
  int local_1bc;
  int *local_1b8;
  int *local_1b0;
  bool local_151;
  QImage local_150 [24];
  QImage local_138 [24];
  QSize local_120;
  undefined8 local_118;
  QSize local_10c;
  QRect local_104;
  undefined8 local_f4;
  undefined8 local_ec;
  QRect local_e4;
  undefined8 local_d4;
  undefined8 local_cc;
  undefined8 local_c4;
  undefined8 local_bc;
  int local_b4;
  int local_b0 [3];
  undefined4 local_a4;
  double local_a0;
  double local_98;
  undefined8 local_90;
  undefined8 local_88;
  QSize local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  QRect local_58;
  QPoint local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = in_R8;
  local_28 = in_R9;
  local_20 = in_RDX;
  local_18 = in_RCX;
  local_10 = in_RSI;
  iVar4 = _setjmp((__jmp_buf_tag *)(in_stack_00000020 + 0xa8));
  if (iVar4 == 0) {
    if (in_stack_00000008 < 0) {
      in_stack_00000008 = 0x4b;
    }
    bVar2 = QRect::isEmpty((QRect *)CONCAT17(in_stack_fffffffffffffd87,
                                             CONCAT16(in_stack_fffffffffffffd86,
                                                      CONCAT24(in_stack_fffffffffffffd84,
                                                               in_stack_fffffffffffffd80))));
    if (!bVar2) {
      bVar2 = QSize::isEmpty((QSize *)in_stack_fffffffffffffd90);
      if ((bVar2) &&
         (bVar2 = QRect::isEmpty((QRect *)CONCAT17(in_stack_fffffffffffffd87,
                                                   CONCAT16(in_stack_fffffffffffffd86,
                                                            CONCAT24(in_stack_fffffffffffffd84,
                                                                     in_stack_fffffffffffffd80)))),
         bVar2)) {
        local_30 = local_20;
        local_28 = local_18;
        QRect::QRect((QRect *)CONCAT17(in_stack_fffffffffffffd87,
                                       CONCAT16(in_stack_fffffffffffffd86,
                                                CONCAT24(in_stack_fffffffffffffd84,
                                                         in_stack_fffffffffffffd80))));
        local_20 = local_40;
        local_18 = local_38;
      }
      else {
        bVar2 = QSize::isEmpty((QSize *)in_stack_fffffffffffffd90);
        if (bVar2) {
          local_48 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffd7c,
                                                      in_stack_fffffffffffffd78));
          QRect::translate((QRect *)CONCAT17(in_stack_fffffffffffffd87,
                                             CONCAT16(in_stack_fffffffffffffd86,
                                                      CONCAT24(in_stack_fffffffffffffd84,
                                                               in_stack_fffffffffffffd80))),
                           (QPoint *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          QVar11 = QRect::intersected((QRect *)CONCAT17(in_stack_fffffffffffffd87,
                                                        CONCAT16(in_stack_fffffffffffffd86,
                                                                 CONCAT24(in_stack_fffffffffffffd84,
                                                                          in_stack_fffffffffffffd80)
                                                                )),
                                      (QRect *)CONCAT44(in_stack_fffffffffffffd7c,
                                                        in_stack_fffffffffffffd78));
          local_58._0_8_ = QVar11._0_8_;
          local_30._0_4_ = local_58.x1.m_i;
          local_30._4_4_ = local_58.y1.m_i;
          local_58._8_8_ = QVar11._8_8_;
          local_28._0_4_ = local_58.x2.m_i;
          local_28._4_4_ = local_58.y2.m_i;
          local_58 = QVar11;
          QRect::QRect((QRect *)CONCAT17(in_stack_fffffffffffffd87,
                                         CONCAT16(in_stack_fffffffffffffd86,
                                                  CONCAT24(in_stack_fffffffffffffd84,
                                                           in_stack_fffffffffffffd80))));
          local_20 = local_68;
          local_18 = local_60;
        }
        else {
          bVar2 = QRect::isEmpty((QRect *)CONCAT17(in_stack_fffffffffffffd87,
                                                   CONCAT16(in_stack_fffffffffffffd86,
                                                            CONCAT24(in_stack_fffffffffffffd84,
                                                                     in_stack_fffffffffffffd80))));
          if (((bVar2) &&
              (uVar6 = *(uint *)(in_stack_00000018 + 0x30), uVar5 = QSize::width((QSize *)0x1079c7),
              uVar6 % uVar5 == 0)) &&
             (uVar6 = *(uint *)(in_stack_00000018 + 0x34), uVar5 = QSize::height((QSize *)0x1079fc),
             uVar6 % uVar5 == 0)) {
            QRect::x((QRect *)0x107a1f);
            QSize::width((QSize *)0x107a3f);
            QRect::y((QRect *)0x107a60);
            QSize::height((QSize *)0x107a80);
            QRect::right((QRect *)0x107aa1);
            QSize::width((QSize *)0x107ac4);
            QRect::bottom((QRect *)0x107aec);
            QSize::height((QSize *)0x107b0f);
            QRect::QRect(in_stack_fffffffffffffd88,
                         CONCAT13(in_stack_fffffffffffffd87,
                                  CONCAT12(in_stack_fffffffffffffd86,in_stack_fffffffffffffd84)),
                         in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
                         in_stack_fffffffffffffd78);
            local_30 = local_78;
            local_28 = local_70;
            local_80 = QRect::size((QRect *)in_stack_fffffffffffffd90);
            local_10 = local_80;
            QRect::QRect((QRect *)CONCAT17(in_stack_fffffffffffffd87,
                                           CONCAT16(in_stack_fffffffffffffd86,
                                                    CONCAT24(in_stack_fffffffffffffd84,
                                                             in_stack_fffffffffffffd80))));
            local_20 = local_90;
            local_18 = local_88;
          }
        }
      }
    }
    bVar2 = QSize::isEmpty((QSize *)in_stack_fffffffffffffd90);
    if (((!bVar2) && (*(int *)(in_stack_00000018 + 0x30) != 0)) &&
       (*(int *)(in_stack_00000018 + 0x34) != 0)) {
      bVar2 = QRect::isEmpty((QRect *)CONCAT17(in_stack_fffffffffffffd87,
                                               CONCAT16(in_stack_fffffffffffffd86,
                                                        CONCAT24(in_stack_fffffffffffffd84,
                                                                 in_stack_fffffffffffffd80))));
      if (bVar2) {
        uVar6 = *(uint *)(in_stack_00000018 + 0x30);
        iVar4 = QSize::width((QSize *)0x107c45);
        local_98 = (double)uVar6 / (double)iVar4;
        uVar6 = *(uint *)(in_stack_00000018 + 0x34);
        iVar4 = QSize::height((QSize *)0x107c85);
        local_a0 = (double)uVar6 / (double)iVar4;
        qMin<double>(&local_98,&local_a0);
        local_a4 = 1;
        local_b0[2] = qCeil<double>(5.33860657351176e-318);
        local_b0[1] = 8;
        piVar8 = qBound<int>((int *)in_stack_fffffffffffffd90,(int *)in_stack_fffffffffffffd88,
                             (int *)CONCAT17(in_stack_fffffffffffffd87,
                                             CONCAT16(in_stack_fffffffffffffd86,
                                                      CONCAT24(in_stack_fffffffffffffd84,
                                                               in_stack_fffffffffffffd80))));
        *(int *)(in_stack_00000018 + 0x44) = *piVar8;
        *(undefined4 *)(in_stack_00000018 + 0x48) = 8;
      }
      else {
        iVar4 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78))
        ;
        local_b0[0] = QSize::width((QSize *)0x107d53);
        local_b0[0] = iVar4 / local_b0[0];
        iVar4 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78)
                             );
        local_b4 = QSize::height((QSize *)0x107d87);
        local_b4 = iVar4 / local_b4;
        piVar8 = qMin<int>(local_b0,&local_b4);
        *(int *)(in_stack_00000018 + 0x48) = *piVar8;
        if (*(uint *)(in_stack_00000018 + 0x48) < 2) {
          *(undefined4 *)(in_stack_00000018 + 0x48) = 1;
        }
        else if (*(uint *)(in_stack_00000018 + 0x48) < 4) {
          *(undefined4 *)(in_stack_00000018 + 0x48) = 2;
        }
        else if (*(uint *)(in_stack_00000018 + 0x48) < 8) {
          *(undefined4 *)(in_stack_00000018 + 0x48) = 4;
        }
        else {
          *(undefined4 *)(in_stack_00000018 + 0x48) = 8;
        }
        *(undefined4 *)(in_stack_00000018 + 0x44) = 1;
        while( true ) {
          bVar2 = false;
          if (1 < *(uint *)(in_stack_00000018 + 0x48)) {
            uVar6 = QRect::x((QRect *)0x107e63);
            bVar2 = true;
            if (uVar6 % *(uint *)(in_stack_00000018 + 0x48) == 0) {
              uVar6 = QRect::y((QRect *)0x107e8b);
              bVar2 = true;
              if (uVar6 % *(uint *)(in_stack_00000018 + 0x48) == 0) {
                uVar6 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffd7c,
                                                       in_stack_fffffffffffffd78));
                bVar2 = true;
                if (uVar6 % *(uint *)(in_stack_00000018 + 0x48) == 0) {
                  uVar6 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffd7c,
                                                          in_stack_fffffffffffffd78));
                  bVar2 = uVar6 % *(uint *)(in_stack_00000018 + 0x48) != 0;
                }
              }
            }
          }
          if (!bVar2) break;
          *(uint *)(in_stack_00000018 + 0x48) = *(uint *)(in_stack_00000018 + 0x48) >> 1;
        }
      }
    }
    if (in_stack_00000008 < 0x32) {
      *(undefined4 *)(in_stack_00000018 + 0x60) = 1;
      *(undefined4 *)(in_stack_00000018 + 100) = 0;
    }
    jpeg_calc_output_dimensions(in_stack_00000018);
    local_c4 = 0xaaaaaaaaaaaaaaaa;
    local_bc = 0xaaaaaaaaaaaaaaaa;
    QRect::QRect(in_stack_fffffffffffffd88,
                 CONCAT13(in_stack_fffffffffffffd87,
                          CONCAT12(in_stack_fffffffffffffd86,in_stack_fffffffffffffd84)),
                 in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78);
    local_d4 = 0xaaaaaaaaaaaaaaaa;
    local_cc = 0xaaaaaaaaaaaaaaaa;
    QRect::QRect((QRect *)CONCAT17(in_stack_fffffffffffffd87,
                                   CONCAT16(in_stack_fffffffffffffd86,
                                            CONCAT24(in_stack_fffffffffffffd84,
                                                     in_stack_fffffffffffffd80))));
    bVar2 = QRect::isEmpty((QRect *)CONCAT17(in_stack_fffffffffffffd87,
                                             CONCAT16(in_stack_fffffffffffffd86,
                                                      CONCAT24(in_stack_fffffffffffffd84,
                                                               in_stack_fffffffffffffd80))));
    if (bVar2) {
      local_d4 = local_c4;
      local_cc = local_bc;
    }
    else if (*(int *)(in_stack_00000018 + 0x48) == *(int *)(in_stack_00000018 + 0x44)) {
      QVar11 = QRect::intersected((QRect *)CONCAT17(in_stack_fffffffffffffd87,
                                                    CONCAT16(in_stack_fffffffffffffd86,
                                                             CONCAT24(in_stack_fffffffffffffd84,
                                                                      in_stack_fffffffffffffd80))),
                                  (QRect *)CONCAT44(in_stack_fffffffffffffd7c,
                                                    in_stack_fffffffffffffd78));
      local_e4._0_8_ = QVar11._0_8_;
      local_d4._0_4_ = local_e4.x1.m_i;
      local_d4._4_4_ = local_e4.y1.m_i;
      local_e4._8_8_ = QVar11._8_8_;
      local_cc._0_4_ = local_e4.x2.m_i;
      local_cc._4_4_ = local_e4.y2.m_i;
      local_e4 = QVar11;
    }
    else {
      QRect::x((QRect *)0x10807c);
      QRect::y((QRect *)0x10809c);
      QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      QRect::QRect(in_stack_fffffffffffffd88,
                   CONCAT13(in_stack_fffffffffffffd87,
                            CONCAT12(in_stack_fffffffffffffd86,in_stack_fffffffffffffd84)),
                   in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78);
      local_d4 = local_f4;
      local_cc = local_ec;
      QVar11 = QRect::intersected((QRect *)CONCAT17(in_stack_fffffffffffffd87,
                                                    CONCAT16(in_stack_fffffffffffffd86,
                                                             CONCAT24(in_stack_fffffffffffffd84,
                                                                      in_stack_fffffffffffffd80))),
                                  (QRect *)CONCAT44(in_stack_fffffffffffffd7c,
                                                    in_stack_fffffffffffffd78));
      local_104._0_8_ = QVar11._0_8_;
      local_d4._0_4_ = local_104.x1.m_i;
      local_d4._4_4_ = local_104.y1.m_i;
      local_104._8_8_ = QVar11._8_8_;
      local_cc._0_4_ = local_104.x2.m_i;
      local_cc._4_4_ = local_104.y2.m_i;
      local_104 = QVar11;
    }
    local_10c = QRect::size((QRect *)in_stack_fffffffffffffd90);
    bVar2 = ensureValidImage(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                             (QSize *)in_stack_fffffffffffffd88);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_211 = false;
      if (*(int *)(in_stack_00000018 + 0x94) == 1) {
        local_211 = operator==((QRect *)CONCAT17(in_stack_fffffffffffffd87,
                                                 CONCAT16(in_stack_fffffffffffffd86,
                                                          CONCAT24(in_stack_fffffffffffffd84,
                                                                   in_stack_fffffffffffffd80))),
                               (QRect *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78
                                                ));
      }
      if (local_211 == false) {
        plVar9 = (long *)(**(code **)(*(long *)(in_stack_00000018 + 8) + 0x10))
                                   (in_stack_00000018,1,
                                    *(int *)(in_stack_00000018 + 0x88) *
                                    *(int *)(in_stack_00000018 + 0x94));
        jpeg_start_decompress(in_stack_00000018);
        while (*(uint *)(in_stack_00000018 + 0xa8) < *(uint *)(in_stack_00000018 + 0x8c)) {
          iVar4 = *(int *)(in_stack_00000018 + 0xa8);
          iVar7 = QRect::y((QRect *)0x1082b4);
          iVar4 = iVar4 - iVar7;
          iVar7 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffd7c,
                                                  in_stack_fffffffffffffd78));
          if (iVar7 <= iVar4) break;
          jpeg_read_scanlines(in_stack_00000018,plVar9,1);
          if (-1 < iVar4) {
            if (*(int *)(in_stack_00000018 + 0x94) == 3) {
              lVar1 = *plVar9;
              iVar4 = QRect::x((QRect *)0x108345);
              uVar10 = QImage::scanLine(in_EDI);
              iVar7 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffd7c,
                                                     in_stack_fffffffffffffd78));
              (*in_stack_00000010)(uVar10,lVar1 + iVar4 * 3,iVar7);
            }
            else if (*(int *)(in_stack_00000018 + 0x40) == 4) {
              lVar1 = *plVar9;
              iVar4 = QRect::x((QRect *)0x1083f4);
              local_1b0 = (int *)(lVar1 + (iVar4 << 2));
              local_1b8 = (int *)QImage::scanLine(in_EDI);
              if ((in_stack_00000028 & 1) == 0) {
                iVar4 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffd7c,
                                                       in_stack_fffffffffffffd78));
                memcpy(local_1b8,local_1b0,(long)(iVar4 << 2));
              }
              else {
                for (local_1bc = 0;
                    iVar4 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffd7c,
                                                           in_stack_fffffffffffffd78)),
                    local_1bc < iVar4; local_1bc = local_1bc + 1) {
                  *local_1b8 = -1 - *local_1b0;
                  local_1b0 = local_1b0 + 1;
                  local_1b8 = local_1b8 + 1;
                }
              }
            }
            else if (*(int *)(in_stack_00000018 + 0x94) == 1) {
              in_stack_fffffffffffffd90 = (jpeg_decompress_struct *)QImage::scanLine(in_EDI);
              in_stack_fffffffffffffd88 = (QRect *)*plVar9;
              iVar4 = QRect::x((QRect *)0x108576);
              __src = (void *)((long)&(in_stack_fffffffffffffd88->x1).m_i + (long)iVar4);
              iVar4 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffd7c,
                                                     in_stack_fffffffffffffd78));
              memcpy(in_stack_fffffffffffffd90,__src,(long)iVar4);
            }
          }
        }
      }
      else {
        jpeg_start_decompress(in_stack_00000018);
        while (*(uint *)(in_stack_00000018 + 0xa8) < *(uint *)(in_stack_00000018 + 0x8c)) {
          local_118 = QImage::scanLine(in_EDI);
          jpeg_read_scanlines(in_stack_00000018,&local_118,1);
        }
      }
      if (*(int *)(in_stack_00000018 + 0xa8) == *(int *)(in_stack_00000018 + 0x8c)) {
        jpeg_finish_decompress(in_stack_00000018);
      }
      if (*(char *)(in_stack_00000018 + 0x17e) == '\x01') {
        QImage::setDotsPerMeterX(in_EDI);
        QImage::setDotsPerMeterY(in_EDI);
      }
      else if (*(char *)(in_stack_00000018 + 0x17e) == '\x02') {
        QImage::setDotsPerMeterX(in_EDI);
        QImage::setDotsPerMeterY(in_EDI);
      }
      bVar2 = QSize::isValid((QSize *)in_stack_fffffffffffffd90);
      uVar12 = false;
      if (bVar2) {
        local_120 = QRect::size((QRect *)in_stack_fffffffffffffd90);
        uVar12 = operator!=((QSize *)CONCAT17(uVar12,CONCAT16(in_stack_fffffffffffffd86,
                                                              CONCAT24(in_stack_fffffffffffffd84,
                                                                       in_stack_fffffffffffffd80))),
                            (QSize *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      }
      if ((bool)uVar12 != false) {
        QImage::scaled((QSize *)local_138,in_EDI,(TransformationMode)&local_10);
        QImage::operator=((QImage *)in_stack_fffffffffffffd88,
                          (QImage *)
                          CONCAT17(uVar12,CONCAT16(in_stack_fffffffffffffd86,
                                                   CONCAT24(in_stack_fffffffffffffd84,
                                                            in_stack_fffffffffffffd80))));
        QImage::~QImage(local_138);
      }
      bVar2 = QRect::isEmpty((QRect *)CONCAT17(uVar12,CONCAT16(in_stack_fffffffffffffd86,
                                                               CONCAT24(in_stack_fffffffffffffd84,
                                                                        in_stack_fffffffffffffd80)))
                            );
      if (!bVar2) {
        QImage::copy((QRect *)local_150);
        QImage::operator=((QImage *)in_stack_fffffffffffffd88,
                          (QImage *)
                          CONCAT17(uVar12,CONCAT16(in_stack_fffffffffffffd86,
                                                   CONCAT24(in_stack_fffffffffffffd84,
                                                            in_stack_fffffffffffffd80))));
        QImage::~QImage(local_150);
      }
      bVar3 = QImage::isNull();
      local_151 = (bool)((bVar3 ^ 0xff) & 1);
    }
    else {
      local_151 = false;
    }
  }
  else {
    my_output_message((j_common_ptr)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    local_151 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_151;
  }
  __stack_chk_fail();
}

Assistant:

static bool read_jpeg_image(QImage *outImage,
                            QSize scaledSize, QRect scaledClipRect,
                            QRect clipRect, int quality,
                            Rgb888ToRgb32Converter converter,
                            j_decompress_ptr info, struct my_error_mgr* err, bool invertCMYK)
{
    if (!setjmp(err->setjmp_buffer)) {
        // -1 means default quality.
        if (quality < 0)
            quality = 75;

        // If possible, merge the scaledClipRect into either scaledSize
        // or clipRect to avoid doing a separate scaled clipping pass.
        // Best results are achieved by clipping before scaling, not after.
        if (!scaledClipRect.isEmpty()) {
            if (scaledSize.isEmpty() && clipRect.isEmpty()) {
                // No clipping or scaling before final clip.
                clipRect = scaledClipRect;
                scaledClipRect = QRect();
            } else if (scaledSize.isEmpty()) {
                // Clipping, but no scaling: combine the clip regions.
                scaledClipRect.translate(clipRect.topLeft());
                clipRect = scaledClipRect.intersected(clipRect);
                scaledClipRect = QRect();
            } else if (clipRect.isEmpty()) {
                // No clipping, but scaling: if we can map back to an
                // integer pixel boundary, then clip before scaling.
                if ((info->image_width % scaledSize.width()) == 0 &&
                        (info->image_height % scaledSize.height()) == 0) {
                    int x = scaledClipRect.x() * info->image_width /
                            scaledSize.width();
                    int y = scaledClipRect.y() * info->image_height /
                            scaledSize.height();
                    int width = (scaledClipRect.right() + 1) *
                                info->image_width / scaledSize.width() - x;
                    int height = (scaledClipRect.bottom() + 1) *
                                 info->image_height / scaledSize.height() - y;
                    clipRect = QRect(x, y, width, height);
                    scaledSize = scaledClipRect.size();
                    scaledClipRect = QRect();
                }
            } else {
                // Clipping and scaling: too difficult to figure out,
                // and not a likely use case, so do it the long way.
            }
        }

        // Determine the scale factor to pass to libjpeg for quick downscaling.
        if (!scaledSize.isEmpty() && info->image_width && info->image_height) {
            if (clipRect.isEmpty()) {
                double f = qMin(double(info->image_width) / scaledSize.width(),
                                double(info->image_height) / scaledSize.height());

                // libjpeg supports M/8 scaling with M=[1,16]. All downscaling factors
                // are a speed improvement, but upscaling during decode is slower.
                info->scale_num   = qBound(1, qCeil(8/f), 8);
                info->scale_denom = 8;
            } else {
                info->scale_denom = qMin(clipRect.width() / scaledSize.width(),
                                         clipRect.height() / scaledSize.height());

                // Only scale by powers of two when clipping so we can
                // keep the exact pixel boundaries
                if (info->scale_denom < 2)
                    info->scale_denom = 1;
                else if (info->scale_denom < 4)
                    info->scale_denom = 2;
                else if (info->scale_denom < 8)
                    info->scale_denom = 4;
                else
                    info->scale_denom = 8;
                info->scale_num = 1;

                // Correct the scale factor so that we clip accurately.
                // It is recommended that the clip rectangle be aligned
                // on an 8-pixel boundary for best performance.
                while (info->scale_denom > 1 &&
                       ((clipRect.x() % info->scale_denom) != 0 ||
                        (clipRect.y() % info->scale_denom) != 0 ||
                        (clipRect.width() % info->scale_denom) != 0 ||
                        (clipRect.height() % info->scale_denom) != 0)) {
                    info->scale_denom /= 2;
                }
            }
        }

        // If high quality not required, use fast decompression
        if ( quality < HIGH_QUALITY_THRESHOLD ) {
            info->dct_method = JDCT_IFAST;
            info->do_fancy_upsampling = FALSE;
        }

        (void) jpeg_calc_output_dimensions(info);

        // Determine the clip region to extract.
        QRect imageRect(0, 0, info->output_width, info->output_height);
        QRect clip;
        if (clipRect.isEmpty()) {
            clip = imageRect;
        } else if (info->scale_denom == info->scale_num) {
            clip = clipRect.intersected(imageRect);
        } else {
            // The scale factor was corrected above to ensure that
            // we don't miss pixels when we scale the clip rectangle.
            clip = QRect(clipRect.x() / int(info->scale_denom),
                         clipRect.y() / int(info->scale_denom),
                         clipRect.width() / int(info->scale_denom),
                         clipRect.height() / int(info->scale_denom));
            clip = clip.intersected(imageRect);
        }

        // Allocate memory for the clipped QImage.
        if (!ensureValidImage(outImage, info, clip.size()))
            return false;

        // Avoid memcpy() overhead if grayscale with no clipping.
        bool quickGray = (info->output_components == 1 &&
                          clip == imageRect);
        if (!quickGray) {
            // Ask the jpeg library to allocate a temporary row.
            // The library will automatically delete it for us later.
            // The libjpeg docs say we should do this before calling
            // jpeg_start_decompress().  We can't use "new" here
            // because we are inside the setjmp() block and an error
            // in the jpeg input stream would cause a memory leak.
            JSAMPARRAY rows = (info->mem->alloc_sarray)
                              ((j_common_ptr)info, JPOOL_IMAGE,
                               info->output_width * info->output_components, 1);

            (void) jpeg_start_decompress(info);

            while (info->output_scanline < info->output_height) {
                int y = int(info->output_scanline) - clip.y();
                if (y >= clip.height())
                    break;      // We've read the entire clip region, so abort.

                (void) jpeg_read_scanlines(info, rows, 1);

                if (y < 0)
                    continue;   // Haven't reached the starting line yet.

                if (info->output_components == 3) {
                    uchar *in = rows[0] + clip.x() * 3;
                    QRgb *out = (QRgb*)outImage->scanLine(y);
                    converter(out, in, clip.width());
                } else if (info->out_color_space == JCS_CMYK) {
                    uchar *in = rows[0] + clip.x() * 4;
                    quint32 *out = (quint32*)outImage->scanLine(y);
                    if (invertCMYK) {
                        for (int i = 0; i < clip.width(); ++i) {
                            *out++ = 0xffffffffu - (in[0] | in[1] << 8 | in[2] << 16 | in[3] << 24);
                            in += 4;
                        }
                    } else {
                        memcpy(out, in, clip.width() * 4);
                    }
                } else if (info->output_components == 1) {
                    // Grayscale.
                    memcpy(outImage->scanLine(y),
                           rows[0] + clip.x(), clip.width());
                }
            }
        } else {
            // Load unclipped grayscale data directly into the QImage.
            (void) jpeg_start_decompress(info);
            while (info->output_scanline < info->output_height) {
                uchar *row = outImage->scanLine(info->output_scanline);
                (void) jpeg_read_scanlines(info, &row, 1);
            }
        }

        if (info->output_scanline == info->output_height)
            (void) jpeg_finish_decompress(info);

        if (info->density_unit == 1) {
            outImage->setDotsPerMeterX(int(100. * info->X_density / 2.54));
            outImage->setDotsPerMeterY(int(100. * info->Y_density / 2.54));
        } else if (info->density_unit == 2) {
            outImage->setDotsPerMeterX(int(100. * info->X_density));
            outImage->setDotsPerMeterY(int(100. * info->Y_density));
        }

        if (scaledSize.isValid() && scaledSize != clip.size()) {
            *outImage = outImage->scaled(scaledSize, Qt::IgnoreAspectRatio, quality >= HIGH_QUALITY_THRESHOLD ? Qt::SmoothTransformation : Qt::FastTransformation);
        }

        if (!scaledClipRect.isEmpty())
            *outImage = outImage->copy(scaledClipRect);
        return !outImage->isNull();
    }
    else {
        my_output_message(j_common_ptr(info));
        return false;
    }
}